

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourcePrelude
          (FileGenerator *this,Printer *p)

{
  google::protobuf::io::Printer::Emit
            (p,0,0,0xa9,
             "\n    PROTOBUF_PRAGMA_INIT_SEG\n    namespace _pb = ::$proto_ns$;\n    namespace _pbi = ::$proto_ns$::internal;\n    namespace _fl = ::$proto_ns$::internal::field_layout;\n  "
            );
  return;
}

Assistant:

void FileGenerator::GenerateSourcePrelude(io::Printer* p) {
  // For MSVC builds, we use #pragma init_seg to move the initialization of our
  // libraries to happen before the user code.
  // This worksaround the fact that MSVC does not do constant initializers when
  // required by the standard.
  p->Emit(R"cc(
    PROTOBUF_PRAGMA_INIT_SEG
    namespace _pb = ::$proto_ns$;
    namespace _pbi = ::$proto_ns$::internal;
    namespace _fl = ::$proto_ns$::internal::field_layout;
  )cc");
}